

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::anon_unknown_8::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ofd,int number,int dx,int dy,int lx,int ly)

{
  pointer ppTVar1;
  TileBuffer *pTVar2;
  void *__stat_loc;
  
  IlmThread_2_5::Task::Task(&this->super_Task,group);
  (this->super_Task)._vptr_Task = (_func_int **)&PTR__TileBufferTask_0049dde8;
  this->_ofd = ofd;
  ppTVar1 = (ofd->tileBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __stat_loc = (void *)((long)(ofd->tileBuffers).
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3);
  pTVar2 = ppTVar1[(ulong)(long)number % (ulong)__stat_loc];
  this->_tileBuffer = pTVar2;
  IlmThread_2_5::Semaphore::wait((Semaphore *)&pTVar2[1].dataSize,__stat_loc);
  pTVar2 = this->_tileBuffer;
  *(int *)&(pTVar2->_sem)._vptr_Semaphore = dx;
  *(int *)((long)&(pTVar2->_sem)._vptr_Semaphore + 4) = dy;
  *(int *)&(pTVar2->_sem)._semaphore = lx;
  *(int *)((long)&(pTVar2->_sem)._semaphore + 4) = ly;
  return;
}

Assistant:

TileBufferTask::TileBufferTask
    (TaskGroup *group,
     DeepTiledOutputFile::Data *ofd,
     int number,
     int dx, int dy,
     int lx, int ly)
:
    Task (group),
    _ofd (ofd),
    _tileBuffer (_ofd->getTileBuffer (number))
{
    //
    // Wait for the tileBuffer to become available
    //

    _tileBuffer->wait ();
    _tileBuffer->tileCoord = TileCoord (dx, dy, lx, ly);
}